

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O3

void google::protobuf::json_internal::ParseProto2Descriptor::SetInt64(Field f,Msg *msg,int64_t x)

{
  byte bVar1;
  bool bVar2;
  size_t __n;
  size_t sVar3;
  int32_t value;
  uint32_t value_00;
  uint64_t value_01;
  Msg *pMVar4;
  char *__s;
  Field pFVar5;
  MaybeOwnedString *this;
  Metadata MVar6;
  string_view sVar7;
  
  RecordAsSeen(f,msg);
  bVar1 = f->field_0x1;
  bVar2 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar2) {
    MVar6 = Message::GetMetadata(msg->msg_);
    if ((bVar1 & 0x20) == 0) {
      Reflection::SetInt64(MVar6.reflection,msg->msg_,f,x);
      return;
    }
    Reflection::AddInt64(MVar6.reflection,msg->msg_,f,x);
    return;
  }
  pMVar4 = (Msg *)(ulong)(0xbf < bVar1);
  pFVar5 = (Field)(ulong)bVar2;
  SetInt64();
  RecordAsSeen(pFVar5,pMVar4);
  bVar1 = pFVar5->field_0x1;
  bVar2 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar2) {
    MVar6 = Message::GetMetadata(pMVar4->msg_);
    if ((bVar1 & 0x20) == 0) {
      Reflection::SetUInt64(MVar6.reflection,pMVar4->msg_,pFVar5,value_01);
      return;
    }
    Reflection::AddUInt64(MVar6.reflection,pMVar4->msg_,pFVar5,value_01);
    return;
  }
  pMVar4 = (Msg *)(ulong)(0xbf < bVar1);
  pFVar5 = (Field)(ulong)bVar2;
  SetUInt64();
  RecordAsSeen(pFVar5,pMVar4);
  bVar1 = pFVar5->field_0x1;
  bVar2 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar2) {
    MVar6 = Message::GetMetadata(pMVar4->msg_);
    if ((bVar1 & 0x20) == 0) {
      Reflection::SetInt32(MVar6.reflection,pMVar4->msg_,pFVar5,value);
      return;
    }
    Reflection::AddInt32(MVar6.reflection,pMVar4->msg_,pFVar5,value);
    return;
  }
  pMVar4 = (Msg *)(ulong)(0xbf < bVar1);
  pFVar5 = (Field)(ulong)bVar2;
  SetInt32();
  RecordAsSeen(pFVar5,pMVar4);
  bVar1 = pFVar5->field_0x1;
  bVar2 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 != bVar2) {
    __s = (char *)(ulong)(0xbf < bVar1);
    this = (MaybeOwnedString *)(ulong)bVar2;
    SetUInt32();
    sVar7 = MaybeOwnedString::AsView(this);
    __n = sVar7._M_len;
    sVar3 = strlen(__s);
    if ((__n == sVar3) && (__n != 0)) {
      bcmp(sVar7._M_str,__s,__n);
    }
    return;
  }
  MVar6 = Message::GetMetadata(pMVar4->msg_);
  if ((bVar1 & 0x20) == 0) {
    Reflection::SetUInt32(MVar6.reflection,pMVar4->msg_,pFVar5,value_00);
    return;
  }
  Reflection::AddUInt32(MVar6.reflection,pMVar4->msg_,pFVar5,value_00);
  return;
}

Assistant:

static void SetInt64(Field f, Msg& msg, int64_t x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddInt64(msg.msg_, f, x);
    } else {
      msg.msg_->GetReflection()->SetInt64(msg.msg_, f, x);
    }
  }